

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O0

XSParticle * __thiscall
xercesc_4_0::XSObjectFactory::createWildcardParticle
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSModel *xsModel)

{
  int iVar1;
  int iVar2;
  XSWildcard *particleTerm;
  XSParticle *particle;
  int m;
  XSWildcard *xsWildcard;
  XSModel *xsModel_local;
  ContentSpecNode *rootNode_local;
  XSObjectFactory *this_local;
  
  particleTerm = createXSWildcard(this,rootNode,xsModel);
  if (particleTerm == (XSWildcard *)0x0) {
    this_local = (XSObjectFactory *)0x0;
  }
  else {
    iVar1 = ContentSpecNode::getMaxOccurs(rootNode);
    this_local = (XSObjectFactory *)XMemory::operator_new(0x50,this->fMemoryManager);
    iVar2 = ContentSpecNode::getMinOccurs(rootNode);
    XSParticle::XSParticle
              ((XSParticle *)this_local,TERM_WILDCARD,xsModel,&particleTerm->super_XSObject,
               (long)iVar2,(long)iVar1,(long)iVar1 == 0xffffffffffffffff,this->fMemoryManager);
  }
  return (XSParticle *)this_local;
}

Assistant:

XSParticle*
XSObjectFactory::createWildcardParticle(const ContentSpecNode* const rootNode,
                                        XSModel* const xsModel)
{
    XSWildcard* xsWildcard = createXSWildcard(rootNode, xsModel);
    if (xsWildcard)
    {
        int m = rootNode->getMaxOccurs();
        XSParticle* particle = new (fMemoryManager) XSParticle
        (
            XSParticle::TERM_WILDCARD
            , xsModel
            , xsWildcard
            , (XMLSize_t)rootNode->getMinOccurs()
            , (XMLSize_t)m
            , m == -1
            , fMemoryManager
        );

        return particle;
    }

    return 0;
}